

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<true>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  pointer pVVar2;
  pointer pVVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  bool bVar6;
  reference pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  VectorType vector_type_p;
  size_type sVar11;
  string_t *psVar12;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  anon_union_16_2_67f50693_for_value local_8a8;
  Vector *local_898;
  string_t *local_890;
  ExpressionState *local_888;
  UnifiedVectorFormat local_880;
  bool local_838 [2056];
  
  pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar3 - (long)pVVar2 == 0x68) {
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar7);
    return;
  }
  local_888 = state;
  if (pVVar3 == pVVar2) {
    switchD_01043a80::default(local_838,0,0x800);
    vector_type_p = CONSTANT_VECTOR;
  }
  else {
    vector_type_p = CONSTANT_VECTOR;
    sVar11 = 0;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
      if (pvVar7->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
      StringVector::AddHeapReference(result,pvVar7);
      sVar11 = sVar11 + 1;
      pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (sVar11 < (ulong)(((long)pVVar3 - (long)pVVar2 >> 3) * 0x4ec4ec4ec4ec4ec5));
    local_890 = (string_t *)result->data;
    local_898 = result;
    switchD_01043a80::default(local_838,0,0x800);
    result = local_898;
    if (pVVar3 != pVVar2) {
      sVar11 = 0;
      do {
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
        if (pvVar7->vector_type == CONSTANT_VECTOR) {
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
          puVar4 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) goto LAB_01a68958;
        }
        else {
LAB_01a68958:
          UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
          Vector::ToUnifiedFormat(pvVar7,args->count,&local_880);
          pdVar5 = local_880.data;
          uVar10 = args->count;
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (uVar10 != 0) {
              uVar10 = 0;
              psVar12 = local_890;
              do {
                uVar9 = uVar10;
                if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                  uVar9 = (ulong)(local_880.sel)->sel_vector[uVar10];
                }
                pdVar1 = pdVar5 + uVar9 * 0x10;
                local_8a8._0_8_ = *(undefined8 *)pdVar1;
                local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
                if ((local_838[uVar10] != true) ||
                   (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                      ((string_t *)&local_8a8.pointer,psVar12), bVar6)) {
                  local_838[uVar10] = true;
                  *(undefined8 *)&psVar12->value = local_8a8._0_8_;
                  (psVar12->value).pointer.ptr = local_8a8.pointer.ptr;
                }
                uVar10 = uVar10 + 1;
                psVar12 = psVar12 + 1;
              } while (uVar10 < args->count);
            }
          }
          else if (uVar10 != 0) {
            uVar9 = 0;
            psVar12 = local_890;
            do {
              uVar8 = uVar9;
              if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                uVar8 = (ulong)(local_880.sel)->sel_vector[uVar9];
              }
              if ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0) ||
                 ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
                pdVar1 = pdVar5 + uVar8 * 0x10;
                local_8a8._0_8_ = *(undefined8 *)pdVar1;
                local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
                if ((local_838[uVar9] != true) ||
                   (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                      ((string_t *)&local_8a8.pointer,psVar12), bVar6)) {
                  local_838[uVar9] = true;
                  *(undefined8 *)&psVar12->value = local_8a8._0_8_;
                  (psVar12->value).pointer.ptr = local_8a8.pointer.ptr;
                }
                uVar10 = args->count;
              }
              uVar9 = uVar9 + 1;
              psVar12 = psVar12 + 1;
            } while (uVar9 < uVar10);
          }
          if (local_880.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        sVar11 = sVar11 + 1;
        result = local_898;
      } while (sVar11 < (ulong)(((long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
  }
  StandardLeastGreatest<true>::FinalizeResult(args->count,local_838,result,local_888);
  Vector::SetVectorType(result,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}